

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O0

void IndexWaitSynced(BaseIndex *index,SignalInterrupt *interrupt)

{
  long lVar1;
  bool bVar2;
  IndexSummary *in_RSI;
  duration<long,_std::ratio<1L,_1000000L>_> *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  bool *in_stack_ffffffffffffffc8;
  byte local_30;
  BaseIndex *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar2 = BaseIndex::BlockUntilSyncedToCurrentChain((BaseIndex *)interrupt);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    bVar2 = util::SignalInterrupt::operator_cast_to_bool((SignalInterrupt *)in_RSI);
    inline_assertion_check<true,bool>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,
               (char *)((CONCAT17(bVar2,in_stack_ffffffffffffffa8) ^ 0xff00000000000000) &
                       0x1ffffffffffffff));
    ms<(char)49,(char)48,(char)48>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<1l,1000l>,void>
              (in_RDI,(duration<long,_std::ratio<1L,_1000L>_> *)in_RSI);
    UninterruptibleSleep((microseconds *)in_RSI);
  }
  BaseIndex::GetSummary(in_stack_ffffffffffffffd8);
  if ((local_30 & 1) != 0) {
    IndexSummary::~IndexSummary(in_RSI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("index.GetSummary().synced",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
                ,0x15,"void IndexWaitSynced(const BaseIndex &, const util::SignalInterrupt &)");
}

Assistant:

void IndexWaitSynced(const BaseIndex& index, const util::SignalInterrupt& interrupt)
{
    while (!index.BlockUntilSyncedToCurrentChain()) {
        // Assert shutdown was not requested to abort the test, instead of looping forever, in case
        // there was an unexpected error in the index that caused it to stop syncing and request a shutdown.
        Assert(!interrupt);

        UninterruptibleSleep(100ms);
    }
    assert(index.GetSummary().synced);
}